

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int64_t fio_atol(char **pstr)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  ushort **ppuVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  undefined8 in_RSI;
  ulong uVar9;
  byte bVar10;
  char *pcVar11;
  char *pcVar12;
  
  pcVar12 = *pstr;
  ppuVar5 = __ctype_b_loc();
  pcVar12 = pcVar12 + -1;
  do {
    pcVar11 = pcVar12;
    cVar2 = pcVar11[1];
    pcVar12 = pcVar11 + 1;
  } while ((*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  uVar6 = (ulong)(((int)cVar2 - 0x2bU & 0xfd) == 0);
  pbVar8 = (byte *)(pcVar12 + uVar6);
  bVar10 = pcVar12[uVar6];
  uVar7 = CONCAT71((int7)((ulong)in_RSI >> 8),bVar10);
  if (0x57 < bVar10) {
    if (bVar10 != 0x78) {
      if (bVar10 == 0x62) goto LAB_0012bf97;
      if (bVar10 != 0x58) goto LAB_0012bed8;
    }
LAB_0012bead:
    bVar10 = pbVar8[1];
    while (pbVar8 = pbVar8 + 1, bVar10 == 0x30) {
      bVar10 = pbVar8[1];
    }
    uVar6 = 0;
    do {
      uVar9 = uVar6;
      if (0xfffffffffffffeff < uVar6) break;
      bVar3 = *pbVar8;
      bVar10 = bVar3 - 0x30;
      if (bVar10 < 10) {
LAB_0012bf25:
        uVar6 = uVar6 << 4 | (ulong)bVar10;
        pbVar8 = pbVar8 + 1;
        bVar4 = true;
      }
      else {
        if ((byte)(bVar3 + 0xbf) < 6) {
          bVar10 = bVar3 - 0x37;
          goto LAB_0012bf25;
        }
        if ((byte)(bVar3 + 0x9f) < 6) {
          bVar10 = bVar3 + 0xa9;
          goto LAB_0012bf25;
        }
        bVar4 = false;
        uVar7 = uVar6;
      }
      uVar9 = uVar7;
    } while (bVar4);
    if (0xf5 < (byte)(*pbVar8 - 0x3a)) {
      return 0;
    }
    if (0xf9 < (byte)((*pbVar8 & 0xdf) + 0xb9)) {
      return 0;
    }
    goto LAB_0012c034;
  }
  if (bVar10 == 0x30) {
    if ((byte)(pcVar11[uVar6 + 2] | 0x20U) != 0x62) {
      if ((byte)(pcVar11[uVar6 + 2] | 0x20U) == 0x78) {
        pbVar8 = (byte *)(pcVar12 + uVar6 + 1);
        goto LAB_0012bead;
      }
      do {
        pbVar1 = pbVar8 + 1;
        pbVar8 = pbVar8 + 1;
      } while (*pbVar1 == 0x30);
      bVar10 = *pbVar8;
      if ((byte)(bVar10 - 0x38) < 0xf8) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar6 = (ulong)((int)(char)bVar10 - 0x30) + uVar6 * 8;
          bVar10 = pbVar8[1];
          pbVar8 = pbVar8 + 1;
          if ((byte)(bVar10 - 0x38) < 0xf8) break;
        } while (uVar6 < 0xffffffffffffffc0);
      }
      if ((*pbVar8 & 0xf8) == 0x30) {
        return 0;
      }
      goto LAB_0012c023;
    }
    pbVar8 = (byte *)(pcVar12 + uVar6 + 1);
  }
  else if (bVar10 != 0x42) {
LAB_0012bed8:
    if ((byte)(bVar10 - 0x3a) < 0xf6) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar6 = (ulong)((int)(char)uVar7 - 0x30) + uVar6 * 10;
        pbVar1 = pbVar8 + 1;
        uVar7 = (ulong)*pbVar1;
        pbVar8 = pbVar8 + 1;
        if ((byte)(*pbVar1 - 0x3a) < 0xf6) break;
      } while (uVar6 < 0xffffffffffffff9c);
    }
    if (0xf5 < (byte)(*pbVar8 - 0x3a)) {
      return 0;
    }
LAB_0012c023:
    uVar9 = 0x7fffffffffffffff;
    if (-1 < (long)uVar6) {
      uVar9 = uVar6;
    }
    goto LAB_0012c034;
  }
LAB_0012bf97:
  bVar10 = pbVar8[1];
  while (pbVar8 = pbVar8 + 1, bVar10 == 0x30) {
    bVar10 = pbVar8[1];
  }
  bVar10 = *pbVar8;
  if ((bVar10 & 0xfe) == 0x30) {
    uVar9 = 0;
    do {
      uVar9 = ((ulong)bVar10 + uVar9 * 2) - 0x30;
      bVar10 = pbVar8[1];
      pbVar8 = pbVar8 + 1;
    } while ((bVar10 & 0xfe) == 0x30);
  }
  else {
    uVar9 = 0;
  }
LAB_0012c034:
  uVar7 = -uVar9;
  if (cVar2 != '-') {
    uVar7 = uVar9;
  }
  *pstr = (char *)pbVar8;
  return uVar7;
}

Assistant:

int64_t fio_atol(char **pstr) {
  /* No binary representation in strtol */
  char *str = *pstr;
  uint64_t result = 0;
  uint8_t invert = 0;
  while (isspace(*str))
    ++(str);
  if (str[0] == '-') {
    invert ^= 1;
    ++str;
  } else if (*str == '+') {
    ++(str);
  }

  if (str[0] == 'B' || str[0] == 'b' ||
      (str[0] == '0' && (str[1] == 'b' || str[1] == 'B'))) {
    /* base 2 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    while (str[0] == '0' || str[0] == '1') {
      result = (result << 1) | (str[0] - '0');
      str++;
    }
    goto sign; /* no overlow protection, since sign might be embedded */

  } else if (str[0] == 'x' || str[0] == 'X' ||
             (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))) {
    /* base 16 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    result = fio_atol_consume_hex(&str);
    if (fio_atol_skip_hex_test(&str)) /* too large for a number */
      return 0;
    goto sign; /* no overlow protection, since sign might be embedded */
  } else if (str[0] == '0') {
    fio_atol_skip_zero(&str);
    /* base 8 */
    result = fio_atol_consume(&str, 8);
    if (fio_atol_skip_test(&str, 8)) /* too large for a number */
      return 0;
  } else {
    /* base 10 */
    result = fio_atol_consume(&str, 10);
    if (fio_atol_skip_test(&str, 10)) /* too large for a number */
      return 0;
  }
  if (result & ((uint64_t)1 << 63))
    result = INT64_MAX; /* signed overflow protection */
sign:
  if (invert)
    result = 0 - result;
  *pstr = str;
  return (int64_t)result;
}